

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::ExplicitUniformLocationCaseBase::runQueryUniform
          (ExplicitUniformLocationCaseBase *this,CompiledProgram *program,Uniform *uniform,
          set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *usedLocations,
          GLint max)

{
  GLuint GVar1;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *psVar2;
  Uniform *program_00;
  bool bVar3;
  bool bVar4;
  key_type kVar5;
  const_reference uniform_00;
  ulong uVar6;
  LayoutSpecifierBase *pLVar7;
  string *psVar8;
  GLchar *pGVar9;
  Logger *pLVar10;
  size_type sVar11;
  const_reference pvVar12;
  bool local_b59;
  key_type local_a9c;
  Logger local_a98;
  _Self local_918;
  key_type local_90c;
  _Self local_908;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_900;
  Logger local_8e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_760;
  Logger local_740;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0;
  Logger local_5a0;
  key_type local_41c;
  undefined1 local_418 [4];
  GLint expected;
  ulong local_400;
  size_t i_1;
  undefined1 local_3f0 [7];
  bool used;
  Logger local_3d0;
  string local_250 [36];
  key_type local_22c;
  string local_228 [4];
  GLint returnedPIQ;
  key_type local_208 [2];
  GLint returned;
  undefined1 local_1f8 [8];
  ostringstream name;
  undefined1 local_60 [7];
  bool runQueries;
  key_type local_48;
  int local_44;
  GLint reservedLocation;
  int arrayElem;
  size_t i;
  long ret;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *psStack_28;
  GLint max_local;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *usedLocations_local;
  Uniform *uniform_local;
  CompiledProgram *program_local;
  ExplicitUniformLocationCaseBase *this_local;
  
  i = 0;
  ret._4_4_ = max;
  psStack_28 = usedLocations;
  usedLocations_local =
       (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)uniform;
  uniform_local = (Uniform *)program;
  program_local = (CompiledProgram *)this;
  bVar3 = UniformType::isStruct(&uniform->type);
  if (bVar3) {
    for (_reservedLocation = 0; uVar6 = _reservedLocation,
        sVar11 = std::
                 vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                 ::size((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                         *)(usedLocations_local + 8)), program_00 = uniform_local, uVar6 < sVar11;
        _reservedLocation = _reservedLocation + 1) {
      uniform_00 = std::
                   vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                   ::operator[]((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                                 *)(usedLocations_local + 8),_reservedLocation);
      uVar6 = runQueryUniform(this,(CompiledProgram *)program_00,uniform_00,psStack_28,ret._4_4_);
      i = uVar6 | i;
    }
  }
  else {
    for (local_44 = 0;
        local_44 <
        *(int *)&(usedLocations_local->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right;
        local_44 = local_44 + 1) {
      local_48 = 0xffffffff;
      pLVar7 = (LayoutSpecifierBase *)(usedLocations_local + 3);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &(uniform_local->type).arraySizesSegmented);
      bVar3 = LayoutSpecifierBase::isImplicit
                        (pLVar7,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
      if (((bVar3 ^ 0xffU) & 1) != 0) {
        local_48 = *(int *)&usedLocations_local[3]._M_t._M_impl + local_44;
      }
      pLVar7 = (LayoutSpecifierBase *)(usedLocations_local + 3);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&name.field_0x170,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &(uniform_local->type).arraySizesSegmented);
      bVar4 = LayoutSpecifierBase::isImplicit
                        (pLVar7,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                &name.field_0x170);
      bVar3 = true;
      if ((!bVar4) && (bVar3 = true, 999 < local_44)) {
        bVar3 = *(int *)&(usedLocations_local->_M_t)._M_impl.super__Rb_tree_header._M_header.
                         _M_right + -1000 < local_44;
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&name.field_0x170);
      if (bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
        psVar8 = glcts::(anonymous_namespace)::Uniform::getName_abi_cxx11_
                           ((Uniform *)usedLocations_local);
        std::operator<<((ostream *)local_1f8,(string *)psVar8);
        UniformType::streamArrayStr
                  ((UniformType *)usedLocations_local,(ostringstream *)local_1f8,local_44);
        GVar1 = (uniform_local->type).enumType;
        std::__cxx11::ostringstream::str();
        pGVar9 = (GLchar *)std::__cxx11::string::c_str();
        kVar5 = glu::CallLogWrapper::glGetUniformLocation
                          (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GVar1,
                           pGVar9);
        std::__cxx11::string::~string(local_228);
        GVar1 = (uniform_local->type).enumType;
        local_208[0] = kVar5;
        std::__cxx11::ostringstream::str();
        pGVar9 = (GLchar *)std::__cxx11::string::c_str();
        kVar5 = glu::CallLogWrapper::glGetProgramResourceLocation
                          (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GVar1,
                           0x92e1,pGVar9);
        std::__cxx11::string::~string(local_250);
        local_22c = kVar5;
        if (local_208[0] != kVar5) {
          i = 0xffffffffffffffff;
          Logger::Logger(&local_3d0);
          pLVar10 = glcts::(anonymous_namespace)::Logger::operator<<
                              ((Logger *)&local_3d0,(char (*) [24])"Locations of  uniform \"");
          std::__cxx11::ostringstream::str();
          pLVar10 = glcts::(anonymous_namespace)::Logger::operator<<
                              ((Logger *)pLVar10,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_3f0);
          pLVar10 = glcts::(anonymous_namespace)::Logger::operator<<
                              ((Logger *)pLVar10,
                               (char (*) [84])
                               "\" returned by glGetUniformLocation and differ glGetProgramResourceLocation differ: "
                              );
          pLVar10 = glcts::(anonymous_namespace)::Logger::operator<<
                              ((Logger *)pLVar10,(int *)local_208);
          pLVar10 = glcts::(anonymous_namespace)::Logger::operator<<
                              ((Logger *)pLVar10,(char (*) [5])0x2a2c5a5);
          pLVar10 = glcts::(anonymous_namespace)::Logger::operator<<
                              ((Logger *)pLVar10,(int *)&local_22c);
          glcts::(anonymous_namespace)::Logger::operator<<
                    ((Logger *)pLVar10,(char (*) [2])0x2b6cb9a);
          std::__cxx11::string::~string((string *)local_3f0);
          Logger::~Logger(&local_3d0);
        }
        i_1._7_1_ = false;
        for (local_400 = 0; uVar6 = local_400,
            sVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                &(uniform_local->type).arraySizesSegmented), uVar6 < sVar11;
            local_400 = local_400 + 1) {
          psVar2 = usedLocations_local + 3;
          pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               &(uniform_local->type).arraySizesSegmented,local_400);
          bVar3 = DefOccurence::occurs
                            ((DefOccurence *)
                             &(psVar2->_M_t)._M_impl.super__Rb_tree_header._M_header.field_0x4,
                             *pvVar12);
          local_b59 = false;
          if (bVar3) {
            psVar2 = usedLocations_local + 3;
            pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                 &(uniform_local->type).arraySizesSegmented,local_400);
            local_b59 = DefOccurence::occurs
                                  ((DefOccurence *)
                                   &(psVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent
                                   ,*pvVar12);
          }
          i_1._7_1_ = (i_1._7_1_ & 1) != 0 || local_b59 != false;
        }
        pLVar7 = (LayoutSpecifierBase *)(usedLocations_local + 3);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_418,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &(uniform_local->type).arraySizesSegmented);
        bVar3 = LayoutSpecifierBase::isImplicit
                          (pLVar7,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_418);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_418);
        if (((bVar3 ^ 0xffU) & 1) == 0) {
          if ((i_1._7_1_ & 1) != 0) {
            if ((int)local_208[0] < 0) {
              i = 0xffffffffffffffff;
              Logger::Logger(&local_740);
              pLVar10 = glcts::(anonymous_namespace)::Logger::operator<<
                                  ((Logger *)&local_740,(char (*) [21])"Unexpected uniform \"");
              std::__cxx11::ostringstream::str();
              pLVar10 = glcts::(anonymous_namespace)::Logger::operator<<
                                  ((Logger *)pLVar10,&local_760);
              pLVar10 = glcts::(anonymous_namespace)::Logger::operator<<
                                  ((Logger *)pLVar10,
                                   (char (*) [42])"\" location: expected positive value, got ");
              pLVar10 = glcts::(anonymous_namespace)::Logger::operator<<
                                  ((Logger *)pLVar10,(int *)local_208);
              glcts::(anonymous_namespace)::Logger::operator<<
                        ((Logger *)pLVar10,(char (*) [2])0x2b6cb9a);
              std::__cxx11::string::~string((string *)&local_760);
              Logger::~Logger(&local_740);
            }
            else {
              local_48 = local_208[0];
            }
          }
        }
        else {
          local_41c = local_48;
          if ((local_48 != local_208[0]) && (((i_1._7_1_ & 1) != 0 || (local_208[0] != 0xffffffff)))
             ) {
            i = 0xffffffffffffffff;
            Logger::Logger(&local_5a0);
            pLVar10 = glcts::(anonymous_namespace)::Logger::operator<<
                                ((Logger *)&local_5a0,(char (*) [21])"Unexpected uniform \"");
            std::__cxx11::ostringstream::str();
            pLVar10 = glcts::(anonymous_namespace)::Logger::operator<<((Logger *)pLVar10,&local_5c0)
            ;
            pLVar10 = glcts::(anonymous_namespace)::Logger::operator<<
                                ((Logger *)pLVar10,(char (*) [22])"\" location: expected ");
            pLVar10 = glcts::(anonymous_namespace)::Logger::operator<<
                                ((Logger *)pLVar10,(int *)&local_41c);
            pLVar10 = glcts::(anonymous_namespace)::Logger::operator<<
                                ((Logger *)pLVar10,(char (*) [7])0x2c67b94);
            pLVar10 = glcts::(anonymous_namespace)::Logger::operator<<
                                ((Logger *)pLVar10,(int *)local_208);
            glcts::(anonymous_namespace)::Logger::operator<<
                      ((Logger *)pLVar10,(char (*) [2])0x2b6cb9a);
            std::__cxx11::string::~string((string *)&local_5c0);
            Logger::~Logger(&local_5a0);
          }
        }
        if ((-1 < (int)local_208[0]) && (ret._4_4_ <= (int)local_208[0])) {
          i = 0xffffffffffffffff;
          Logger::Logger(&local_8e0);
          pLVar10 = glcts::(anonymous_namespace)::Logger::operator<<
                              ((Logger *)&local_8e0,(char (*) [10])0x2c6772a);
          std::__cxx11::ostringstream::str();
          pLVar10 = glcts::(anonymous_namespace)::Logger::operator<<((Logger *)pLVar10,&local_900);
          pLVar10 = glcts::(anonymous_namespace)::Logger::operator<<
                              ((Logger *)pLVar10,(char (*) [22])"\" returned location (");
          pLVar10 = glcts::(anonymous_namespace)::Logger::operator<<
                              ((Logger *)pLVar10,(int *)local_208);
          pLVar10 = glcts::(anonymous_namespace)::Logger::operator<<
                              ((Logger *)pLVar10,
                               (char (*) [51])") is greater than implementation dependent limit (");
          pLVar10 = glcts::(anonymous_namespace)::Logger::operator<<
                              ((Logger *)pLVar10,(int *)((long)&ret + 4));
          glcts::(anonymous_namespace)::Logger::operator<<
                    ((Logger *)pLVar10,(char (*) [3])0x2c23dab);
          std::__cxx11::string::~string((string *)&local_900);
          Logger::~Logger(&local_8e0);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
      }
      if (-1 < (int)local_48) {
        local_90c = local_48;
        local_908._M_node =
             (_Base_ptr)
             std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::find
                       (psStack_28,&local_90c);
        local_918._M_node =
             (_Base_ptr)
             std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                       (psStack_28);
        bVar3 = std::operator!=(&local_908,&local_918);
        if (bVar3) {
          i = 0xffffffffffffffff;
          Logger::Logger(&local_a98);
          pLVar10 = glcts::(anonymous_namespace)::Logger::operator<<
                              ((Logger *)&local_a98,(char (*) [19])"Uniform location (");
          pLVar10 = glcts::(anonymous_namespace)::Logger::operator<<
                              ((Logger *)pLVar10,(int *)&local_48);
          glcts::(anonymous_namespace)::Logger::operator<<
                    ((Logger *)pLVar10,(char (*) [17])") is not unique.");
          Logger::~Logger(&local_a98);
        }
        local_a9c = local_48;
        std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                  (psStack_28,&local_a9c);
      }
    }
  }
  return i;
}

Assistant:

long runQueryUniform(const CompiledProgram& program, const Uniform& uniform, std::set<GLuint>& usedLocations,
						 GLint max)
	{
		long ret = NO_ERROR;

		/*
		 glGetUniformLocation(program, name);
		 Query passes if returned value is unique in current program, matches
		 explicit location (if passed in GLSL code) and is less than value of
		 GL_MAX_UNIFORM_LOCATIONS.

		 glGetProgramResourceLocation(program, GL_UNIFIORM, name);
		 Query passes if returned value matches value returned from
		 glGetUniformLocation().
		 */

		if (uniform.type.isStruct())
		{
			for (size_t i = 0; i < uniform.childUniforms.size(); i++)
			{
				ret |= runQueryUniform(program, uniform.childUniforms[i], usedLocations, max);
			}
		}
		else
		{
			for (int arrayElem = 0; arrayElem < uniform.type.arraySize; arrayElem++)
			{

				/* Location that is taken by this uniform (even if not used).*/
				GLint reservedLocation = -1;
				if (!uniform.location.isImplicit(program.stages))
				{
					reservedLocation = uniform.location.val + arrayElem;
				}

				//optimization: for continuous arrays run queries at the beging and end only.
				bool runQueries = uniform.location.isImplicit(program.stages) ||
								  (arrayElem < 1000 || arrayElem > uniform.type.arraySize - 1000);

				if (runQueries)
				{
					std::ostringstream name;
					name << uniform.getName();
					uniform.type.streamArrayStr(name, arrayElem);
					GLint returned = glGetUniformLocation(program.name, name.str().c_str());

					GLint returnedPIQ = glGetProgramResourceLocation(program.name, GL_UNIFORM, name.str().c_str());

					if (returned != returnedPIQ)
					{
						ret |= ERROR;
						Logger()
							<< "Locations of  uniform \"" << name.str()
							<< "\" returned by glGetUniformLocation and differ glGetProgramResourceLocation differ: "
							<< returned << " != " << returnedPIQ << ".";
					}

					bool used = false;
					for (size_t i = 0; i < program.stages.size(); i++)
					{
						used |= uniform.declOccurence.occurs(program.stages[i]) &&
								uniform.usageOccurence.occurs(program.stages[i]);
					}

					if (!uniform.location.isImplicit(program.stages))
					{
						//Validate uniform location against explicit value
						GLint expected = reservedLocation;
						if (!(expected == returned || (!used && returned == -1)))
						{
							ret |= ERROR;
							Logger() << "Unexpected uniform \"" << name.str() << "\" location: expected " << expected
									 << ", got " << returned << ".";
						}
					}
					else
					{
						//Check if location > 0 if used;
						if (used)
						{
							if (returned < 0)
							{
								ret |= ERROR;
								Logger() << "Unexpected uniform \"" << name.str()
										 << "\" location: expected positive value, got " << returned << ".";
							}
							else
							{
								reservedLocation = returned;
							}
						}
					}

					if (returned >= 0)
					{
						//check if location is less than max

						if (returned >= max)
						{
							ret |= ERROR;
							Logger() << "Uniform \"" << name.str() << "\" returned location (" << returned
									 << ") is greater than implementation dependent limit (" << max << ").";
						}
					}
				} //if (runQueries)

				//usedLocations is always checked (even if queries were not run.
				if (reservedLocation >= 0)
				{
					//check if location is unique
					if (usedLocations.find(reservedLocation) != usedLocations.end())
					{
						ret |= ERROR;
						Logger() << "Uniform location (" << reservedLocation << ") is not unique.";
					}
					usedLocations.insert(reservedLocation);
				}
			}
		}
		return ret;
	}